

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# draco_encoder.cc
# Opt level: O2

int main(int argc,char **argv)

{
  byte bVar1;
  byte *__s2;
  Code CVar2;
  bool bVar3;
  int iVar4;
  int32_t iVar5;
  ExpertEncoder *this;
  int64_t iVar6;
  uint uVar7;
  int iVar8;
  undefined4 in_register_0000003c;
  char *pcVar9;
  _Head_base<0UL,_draco::Mesh_*,_false> mesh;
  _Alloc_hider _Var10;
  pointer __p;
  _Head_base<0UL,_draco::Mesh_*,_false> this_00;
  int iVar11;
  allocator<char> local_249;
  Options options;
  undefined1 local_1e0 [8];
  _Alloc_hider local_1d8;
  undefined8 local_1b8;
  StatusOr<std::unique_ptr<draco::Mesh,_std::default_delete<draco::Mesh>_>_> maybe_mesh;
  CycleTimer timer;
  Encoder encoder;
  undefined1 local_58 [40];
  
  local_1b8 = CONCAT44(in_register_0000003c,argc);
  options.is_point_cloud = false;
  options.pos_quantization_bits = 0xb;
  options.tex_coords_quantization_bits = 10;
  options.tex_coords_deleted = false;
  options.normals_quantization_bits = 8;
  options.normals_deleted = false;
  options.generic_deleted = false;
  options.compression_level = 7;
  options.preserve_polygons = false;
  options.use_metadata = false;
  options.input._M_dataplus._M_p = (pointer)&options.input.field_2;
  options.input._M_string_length = 0;
  options.input.field_2._M_local_buf[0] = '\0';
  options.output._M_dataplus._M_p = (pointer)&options.output.field_2;
  options.output._M_string_length = 0;
  options.output.field_2._M_local_buf[0] = '\0';
  iVar11 = 1;
  options.generic_quantization_bits = options.normals_quantization_bits;
LAB_0010f236:
  if ((int)local_1b8 <= iVar11) goto LAB_0010f5b9;
  __s2 = (byte *)argv[iVar11];
  bVar1 = *__s2;
  iVar4 = -(bVar1 - 0x2d);
  iVar8 = iVar4;
  if (bVar1 == 0x2d) {
    uVar7 = __s2[1] - 0x68;
    if (uVar7 == 0) {
      uVar7 = (uint)__s2[2];
    }
    if (uVar7 != 0) {
      uVar7 = __s2[1] - 0x3f;
      if (uVar7 == 0) {
        uVar7 = (uint)__s2[2];
      }
      iVar8 = -uVar7;
      goto LAB_0010f288;
    }
LAB_0010f5ad:
    anon_unknown.dwarf_8000::Usage();
    iVar11 = 0;
    goto LAB_0010fd71;
  }
LAB_0010f288:
  if (iVar8 == 0) goto LAB_0010f5ad;
  if (bVar1 == 0x2d) {
    uVar7 = __s2[1] - 0x69;
    if (uVar7 == 0) {
      uVar7 = (uint)__s2[2];
    }
    if ((uVar7 != 0) || (argc + -1 <= iVar11)) {
      uVar7 = __s2[1] - 0x6f;
      if (uVar7 == 0) {
        uVar7 = (uint)__s2[2];
      }
      iVar4 = -uVar7;
      goto LAB_0010f2d7;
    }
    std::__cxx11::string::assign((char *)&options.input);
  }
  else {
LAB_0010f2d7:
    bVar3 = iVar11 < argc + -1;
    if ((iVar4 == 0) && (bVar3)) {
      std::__cxx11::string::assign((char *)&options.output);
      goto LAB_0010f495;
    }
    iVar8 = strcmp("-point_cloud",(char *)__s2);
    if (iVar8 == 0) {
      options.is_point_cloud = true;
      goto LAB_0010f498;
    }
    iVar8 = strcmp("-qp",(char *)__s2);
    if (iVar8 == 0 && bVar3) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&encoder,argv[(long)iVar11 + 1],(allocator<char> *)&maybe_mesh);
      options.pos_quantization_bits = anon_unknown.dwarf_8000::StringToInt((string *)&encoder);
      std::__cxx11::string::~string((string *)&encoder);
      if (options.pos_quantization_bits < 0x1f) goto LAB_0010f495;
      pcVar9 = "Error: The maximum number of quantization bits for the position attribute is 30.";
LAB_0010fd69:
      puts(pcVar9);
      goto LAB_0010fd6e;
    }
    iVar8 = strcmp("-qt",(char *)__s2);
    if (iVar8 == 0 && bVar3) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&encoder,argv[(long)iVar11 + 1],(allocator<char> *)&maybe_mesh);
      options.tex_coords_quantization_bits =
           anon_unknown.dwarf_8000::StringToInt((string *)&encoder);
      std::__cxx11::string::~string((string *)&encoder);
      if (0x1e < options.tex_coords_quantization_bits) {
        pcVar9 = 
        "Error: The maximum number of quantization bits for the texture coordinate attribute is 30."
        ;
        goto LAB_0010fd69;
      }
    }
    else {
      iVar8 = strcmp("-qn",(char *)__s2);
      if (iVar8 == 0 && bVar3) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&encoder,argv[(long)iVar11 + 1],(allocator<char> *)&maybe_mesh);
        options.normals_quantization_bits = anon_unknown.dwarf_8000::StringToInt((string *)&encoder)
        ;
        std::__cxx11::string::~string((string *)&encoder);
        if (0x1e < options.normals_quantization_bits) {
          pcVar9 = "Error: The maximum number of quantization bits for the normal attribute is 30.";
          goto LAB_0010fd69;
        }
      }
      else {
        iVar8 = strcmp("-qg",(char *)__s2);
        if (iVar8 != 0 || !bVar3) {
          iVar8 = strcmp("-cl",(char *)__s2);
          if (iVar8 == 0 && bVar3) {
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&encoder,argv[(long)iVar11 + 1],(allocator<char> *)&maybe_mesh);
            options.compression_level = anon_unknown.dwarf_8000::StringToInt((string *)&encoder);
            std::__cxx11::string::~string((string *)&encoder);
            iVar11 = iVar11 + 1;
          }
          else {
            iVar8 = strcmp("--skip",(char *)__s2);
            if (iVar8 == 0 && bVar3) {
              iVar4 = iVar11 + 1;
              pcVar9 = argv[(long)iVar11 + 1];
              iVar8 = strcmp("NORMAL",pcVar9);
              iVar11 = iVar4;
              if (iVar8 == 0) {
                options.normals_quantization_bits = -1;
              }
              else {
                iVar8 = strcmp("TEX_COORD",pcVar9);
                if (iVar8 == 0) {
                  options.tex_coords_quantization_bits = -1;
                }
                else {
                  iVar8 = strcmp("GENERIC",pcVar9);
                  if (iVar8 != 0) {
                    pcVar9 = "Error: Invalid attribute name after --skip";
                    goto LAB_0010fd69;
                  }
                  options.generic_quantization_bits = -1;
                }
              }
            }
            else {
              iVar8 = strcmp("--metadata",(char *)__s2);
              if (iVar8 == 0) {
                options.use_metadata = true;
              }
              else {
                iVar8 = strcmp("-preserve_polygons",(char *)__s2);
                if (iVar8 == 0) {
                  options.preserve_polygons = true;
                }
              }
            }
          }
          goto LAB_0010f498;
        }
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&encoder,argv[(long)iVar11 + 1],(allocator<char> *)&maybe_mesh);
        options.generic_quantization_bits = anon_unknown.dwarf_8000::StringToInt((string *)&encoder)
        ;
        std::__cxx11::string::~string((string *)&encoder);
        if (0x1e < options.generic_quantization_bits) {
          pcVar9 = "Error: The maximum number of quantization bits for generic attributes is 30.";
          goto LAB_0010fd69;
        }
      }
    }
  }
LAB_0010f495:
  iVar11 = iVar11 + 1;
LAB_0010f498:
  iVar11 = iVar11 + 1;
  goto LAB_0010f236;
LAB_0010f5b9:
  if (((int)local_1b8 < 3) || (options.input._M_string_length == 0)) {
    anon_unknown.dwarf_8000::Usage();
LAB_0010fd6e:
    iVar11 = -1;
    goto LAB_0010fd71;
  }
  if (options.is_point_cloud == false) {
    encoder.super_EncoderBase<draco::EncoderOptionsBase<draco::GeometryAttribute::Type>_>.options_.
    super_DracoOptions<draco::GeometryAttribute::Type>.global_options_.options_._M_t._M_impl.
    super__Rb_tree_header._M_header._M_parent =
         (_Base_ptr)
         &encoder.super_EncoderBase<draco::EncoderOptionsBase<draco::GeometryAttribute::Type>_>.
          options_;
    encoder.super_EncoderBase<draco::EncoderOptionsBase<draco::GeometryAttribute::Type>_>.options_.
    super_DracoOptions<draco::GeometryAttribute::Type>.global_options_.options_._M_t._M_impl._0_4_ =
         0;
    encoder.super_EncoderBase<draco::EncoderOptionsBase<draco::GeometryAttribute::Type>_>.options_.
    super_DracoOptions<draco::GeometryAttribute::Type>.global_options_.options_._M_t._M_impl.
    super__Rb_tree_header._M_header._M_color = _S_red;
    encoder.super_EncoderBase<draco::EncoderOptionsBase<draco::GeometryAttribute::Type>_>.options_.
    super_DracoOptions<draco::GeometryAttribute::Type>.global_options_.options_._M_t._M_impl.
    super__Rb_tree_header._M_header._4_4_ = 0;
    encoder.super_EncoderBase<draco::EncoderOptionsBase<draco::GeometryAttribute::Type>_>.options_.
    super_DracoOptions<draco::GeometryAttribute::Type>.global_options_.options_._M_t._M_impl.
    super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
    encoder.super_EncoderBase<draco::EncoderOptionsBase<draco::GeometryAttribute::Type>_>.options_.
    super_DracoOptions<draco::GeometryAttribute::Type>.global_options_.options_._M_t._M_impl.
    super__Rb_tree_header._M_header._M_left =
         encoder.super_EncoderBase<draco::EncoderOptionsBase<draco::GeometryAttribute::Type>_>.
         options_.super_DracoOptions<draco::GeometryAttribute::Type>.global_options_.options_._M_t.
         _M_impl.super__Rb_tree_header._M_header._M_parent;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&maybe_mesh,"use_metadata",(allocator<char> *)local_1e0);
    draco::Options::SetBool((Options *)&encoder,(string *)&maybe_mesh,options.use_metadata);
    std::__cxx11::string::~string((string *)&maybe_mesh);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&maybe_mesh,"preserve_polygons",(allocator<char> *)local_1e0);
    draco::Options::SetBool((Options *)&encoder,(string *)&maybe_mesh,options.preserve_polygons);
    std::__cxx11::string::~string((string *)&maybe_mesh);
    draco::ReadMeshFromFile(&maybe_mesh,&options.input,(Options *)&encoder);
    mesh._M_head_impl = (Mesh *)maybe_mesh.value_;
    CVar2 = maybe_mesh.status_.code_;
    if (maybe_mesh.status_.code_ == OK) {
      maybe_mesh.value_._M_t.super___uniq_ptr_impl<draco::Mesh,_std::default_delete<draco::Mesh>_>.
      _M_t.super__Tuple_impl<0UL,_draco::Mesh_*,_std::default_delete<draco::Mesh>_>.
      super__Head_base<0UL,_draco::Mesh_*,_false>._M_head_impl =
           (__uniq_ptr_data<draco::Mesh,_std::default_delete<draco::Mesh>,_true,_true>)
           (__uniq_ptr_impl<draco::Mesh,_std::default_delete<draco::Mesh>_>)0x0;
      iVar11 = 0;
    }
    else {
      iVar11 = -1;
      mesh._M_head_impl = (Mesh *)0x0;
      printf("Failed loading the input mesh: %s.\n");
    }
    draco::StatusOr<std::unique_ptr<draco::Mesh,_std::default_delete<draco::Mesh>_>_>::~StatusOr
              (&maybe_mesh);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)&encoder);
    this_00._M_head_impl = mesh._M_head_impl;
    if (CVar2 == OK) goto LAB_0010f76f;
  }
  else {
    draco::ReadPointCloudFromFile
              ((StatusOr<std::unique_ptr<draco::PointCloud,_std::default_delete<draco::PointCloud>_>_>
                *)&encoder,&options.input);
    this_00._M_head_impl =
         (Mesh *)encoder.
                 super_EncoderBase<draco::EncoderOptionsBase<draco::GeometryAttribute::Type>_>.
                 options_.super_DracoOptions<draco::GeometryAttribute::Type>.global_options_.
                 options_._M_t._M_impl.super__Rb_tree_header._M_header._M_right;
    if ((int)encoder.super_EncoderBase<draco::EncoderOptionsBase<draco::GeometryAttribute::Type>_>.
             _vptr_EncoderBase == 0) {
      encoder.super_EncoderBase<draco::EncoderOptionsBase<draco::GeometryAttribute::Type>_>.options_
      .super_DracoOptions<draco::GeometryAttribute::Type>.global_options_.options_._M_t._M_impl.
      super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
      iVar11 = 0;
    }
    else {
      this_00._M_head_impl = (Mesh *)0x0;
      printf("Failed loading the input point cloud: %s.\n");
      iVar11 = -1;
    }
    draco::StatusOr<std::unique_ptr<draco::PointCloud,_std::default_delete<draco::PointCloud>_>_>::
    ~StatusOr((StatusOr<std::unique_ptr<draco::PointCloud,_std::default_delete<draco::PointCloud>_>_>
               *)&encoder);
    mesh._M_head_impl = this_00._M_head_impl;
    if ((int)encoder.super_EncoderBase<draco::EncoderOptionsBase<draco::GeometryAttribute::Type>_>.
             _vptr_EncoderBase == 0) {
      mesh._M_head_impl = (Mesh *)0x0;
LAB_0010f76f:
      if (options.pos_quantization_bits < 0) {
        puts("Error: Position attribute cannot be skipped.");
        iVar11 = -1;
        mesh._M_head_impl = this_00._M_head_impl;
      }
      else {
        if (options.tex_coords_quantization_bits < 0) {
          iVar5 = draco::PointCloud::NumNamedAttributes
                            (&(this_00._M_head_impl)->super_PointCloud,TEX_COORD);
          if (0 < iVar5) {
            options.tex_coords_deleted = true;
          }
          while (iVar5 = draco::PointCloud::NumNamedAttributes
                                   (&(this_00._M_head_impl)->super_PointCloud,TEX_COORD), 0 < iVar5)
          {
            iVar5 = draco::PointCloud::GetNamedAttributeId
                              (&(this_00._M_head_impl)->super_PointCloud,TEX_COORD,0);
            (**(code **)(*(long *)this_00._M_head_impl + 0x18))(this_00._M_head_impl,iVar5);
          }
        }
        if (options.normals_quantization_bits < 0) {
          iVar5 = draco::PointCloud::NumNamedAttributes
                            (&(this_00._M_head_impl)->super_PointCloud,NORMAL);
          if (0 < iVar5) {
            options.normals_deleted = true;
          }
          while (iVar5 = draco::PointCloud::NumNamedAttributes
                                   (&(this_00._M_head_impl)->super_PointCloud,NORMAL), 0 < iVar5) {
            iVar5 = draco::PointCloud::GetNamedAttributeId
                              (&(this_00._M_head_impl)->super_PointCloud,NORMAL,0);
            (**(code **)(*(long *)this_00._M_head_impl + 0x18))(this_00._M_head_impl,iVar5);
          }
        }
        if (options.generic_quantization_bits < 0) {
          iVar5 = draco::PointCloud::NumNamedAttributes
                            (&(this_00._M_head_impl)->super_PointCloud,GENERIC);
          if (0 < iVar5) {
            options.generic_deleted = true;
          }
          while (iVar5 = draco::PointCloud::NumNamedAttributes
                                   (&(this_00._M_head_impl)->super_PointCloud,GENERIC), 0 < iVar5) {
            iVar5 = draco::PointCloud::GetNamedAttributeId
                              (&(this_00._M_head_impl)->super_PointCloud,GENERIC,0);
            (**(code **)(*(long *)this_00._M_head_impl + 0x18))(this_00._M_head_impl,iVar5);
          }
        }
        if (((options.tex_coords_deleted != false) || (options.normals_deleted != false)) ||
           (options.generic_deleted == true)) {
          (**(code **)(*(long *)this_00._M_head_impl + 0x28))(this_00._M_head_impl);
        }
        iVar11 = 10 - options.compression_level;
        draco::Encoder::Encoder(&encoder);
        if (0 < options.pos_quantization_bits) {
          draco::Encoder::SetAttributeQuantization(&encoder,POSITION,options.pos_quantization_bits);
        }
        if (0 < options.tex_coords_quantization_bits) {
          draco::Encoder::SetAttributeQuantization
                    (&encoder,TEX_COORD,options.tex_coords_quantization_bits);
        }
        if (0 < options.normals_quantization_bits) {
          draco::Encoder::SetAttributeQuantization
                    (&encoder,NORMAL,options.normals_quantization_bits);
        }
        if (0 < options.generic_quantization_bits) {
          draco::Encoder::SetAttributeQuantization
                    (&encoder,GENERIC,options.generic_quantization_bits);
        }
        draco::Encoder::SetSpeedOptions(&encoder,iVar11,iVar11);
        if (options.output._M_string_length == 0) {
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &maybe_mesh,&options.input,".drc");
          std::__cxx11::string::operator=((string *)&options.output,(string *)&maybe_mesh);
          std::__cxx11::string::~string((string *)&maybe_mesh);
        }
        puts("Encoder options:");
        printf("  Compression level = %d\n",(ulong)(uint)options.compression_level);
        if (options.pos_quantization_bits == 0) {
          puts("  Positions: No quantization");
        }
        else {
          printf("  Positions: Quantization = %d bits\n");
        }
        iVar5 = draco::PointCloud::GetNamedAttributeId
                          (&(this_00._M_head_impl)->super_PointCloud,TEX_COORD);
        if (iVar5 < 0) {
          if (options.tex_coords_deleted == true) {
            pcVar9 = "  Texture coordinates: Skipped";
            goto LAB_0010f9e8;
          }
        }
        else if (options.tex_coords_quantization_bits == 0) {
          pcVar9 = "  Texture coordinates: No quantization";
LAB_0010f9e8:
          puts(pcVar9);
        }
        else {
          printf("  Texture coordinates: Quantization = %d bits\n");
        }
        iVar5 = draco::PointCloud::GetNamedAttributeId
                          (&(this_00._M_head_impl)->super_PointCloud,NORMAL);
        if (iVar5 < 0) {
          if (options.normals_deleted == true) {
            pcVar9 = "  Normals: Skipped";
            goto LAB_0010fa2b;
          }
        }
        else if (options.normals_quantization_bits == 0) {
          pcVar9 = "  Normals: No quantization";
LAB_0010fa2b:
          puts(pcVar9);
        }
        else {
          printf("  Normals: Quantization = %d bits\n");
        }
        iVar5 = draco::PointCloud::GetNamedAttributeId
                          (&(this_00._M_head_impl)->super_PointCloud,GENERIC);
        if (iVar5 < 0) {
          if (options.generic_deleted == true) {
            pcVar9 = "  Generic: Skipped";
            goto LAB_0010fa6e;
          }
        }
        else if (options.generic_quantization_bits == 0) {
          pcVar9 = "  Generic: No quantization";
LAB_0010fa6e:
          puts(pcVar9);
        }
        else {
          printf("  Generic: Quantization = %d bits\n");
        }
        putchar(10);
        if ((mesh._M_head_impl == (Mesh *)0x0) ||
           ((int)(((long)*(pointer *)((long)mesh._M_head_impl + 200) -
                  (long)(((IndexTypeVector<draco::IndexType<unsigned_int,_draco::FaceIndex_tag_type_>,_std::array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>_>
                           *)((long)mesh._M_head_impl + 0xc0))->vector_).
                        super__Vector_base<std::array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>,_std::allocator<std::array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>_>_>
                        ._M_impl.super__Vector_impl_data._M_start) / 0xc) == 0)) {
          this = (ExpertEncoder *)operator_new(0xb8);
          draco::ExpertEncoder::ExpertEncoder(this,&(this_00._M_head_impl)->super_PointCloud);
          bVar3 = false;
        }
        else {
          this = (ExpertEncoder *)operator_new(0xb8);
          bVar3 = true;
          draco::ExpertEncoder::ExpertEncoder(this,mesh._M_head_impl);
        }
        draco::Encoder::CreateExpertEncoderOptions
                  ((EncoderOptions *)&maybe_mesh,&encoder,&(this_00._M_head_impl)->super_PointCloud)
        ;
        draco::ExpertEncoder::Reset(this,(EncoderOptions *)&maybe_mesh);
        draco::EncoderOptionsBase<int>::~EncoderOptionsBase((EncoderOptionsBase<int> *)&maybe_mesh);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&maybe_mesh,"name",(allocator<char> *)&timer);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_1e0,"added_edges",&local_249);
        iVar11 = draco::PointCloud::GetAttributeIdByMetadataEntry
                           (&(this_00._M_head_impl)->super_PointCloud,(string *)&maybe_mesh,
                            (string *)local_1e0);
        std::__cxx11::string::~string((string *)local_1e0);
        std::__cxx11::string::~string((string *)&maybe_mesh);
        if (iVar11 != -1) {
          draco::ExpertEncoder::SetAttributePredictionScheme((Status *)local_58,this,iVar11,-2);
          std::__cxx11::string::~string((string *)(local_58 + 8));
        }
        if (bVar3) {
          draco::EncoderBuffer::EncoderBuffer((EncoderBuffer *)&maybe_mesh);
          draco::DracoTimer::Start(&timer);
          draco::ExpertEncoder::EncodeToBuffer
                    ((Status *)local_1e0,this,(EncoderBuffer *)&maybe_mesh);
          if (local_1e0._0_4_ != OK) {
            pcVar9 = "Failed to encode the mesh.";
LAB_0010fc18:
            puts(pcVar9);
            goto LAB_0010fc25;
          }
          draco::DracoTimer::Stop(&timer);
          bVar3 = draco::WriteBufferToFile
                            ((char *)CONCAT44(maybe_mesh.status_._4_4_,maybe_mesh.status_.code_),
                             (long)maybe_mesh.status_.error_msg_._M_dataplus._M_p -
                             (long)CONCAT44(maybe_mesh.status_._4_4_,maybe_mesh.status_.code_),
                             &options.output);
          _Var10 = options.output._M_dataplus;
          if (!bVar3) {
            local_1d8._M_p = "Failed to create the output file.";
            goto LAB_0010fc25;
          }
          iVar6 = draco::DracoTimer::GetInMs(&timer);
          pcVar9 = "Encoded mesh saved to %s (%ld ms to encode).\n";
LAB_0010fd30:
          iVar11 = 0;
          printf(pcVar9,_Var10._M_p,iVar6);
          printf("\nEncoded size = %zu bytes\n\n",
                 (long)maybe_mesh.status_.error_msg_._M_dataplus._M_p -
                 CONCAT44(maybe_mesh.status_._4_4_,maybe_mesh.status_.code_));
        }
        else {
          draco::EncoderBuffer::EncoderBuffer((EncoderBuffer *)&maybe_mesh);
          draco::DracoTimer::Start(&timer);
          draco::ExpertEncoder::EncodeToBuffer
                    ((Status *)local_1e0,this,(EncoderBuffer *)&maybe_mesh);
          if (local_1e0._0_4_ != OK) {
            pcVar9 = "Failed to encode the point cloud.";
            goto LAB_0010fc18;
          }
          draco::DracoTimer::Stop(&timer);
          bVar3 = draco::WriteBufferToFile
                            ((char *)CONCAT44(maybe_mesh.status_._4_4_,maybe_mesh.status_.code_),
                             (long)maybe_mesh.status_.error_msg_._M_dataplus._M_p -
                             (long)CONCAT44(maybe_mesh.status_._4_4_,maybe_mesh.status_.code_),
                             &options.output);
          _Var10 = options.output._M_dataplus;
          if (bVar3) {
            iVar6 = draco::DracoTimer::GetInMs(&timer);
            pcVar9 = "Encoded point cloud saved to %s (%ld ms to encode).\n";
            goto LAB_0010fd30;
          }
          local_1d8._M_p = "Failed to write the output file.";
LAB_0010fc25:
          puts(local_1d8._M_p);
          iVar11 = -1;
        }
        std::__cxx11::string::~string((string *)&local_1d8);
        draco::EncoderBuffer::~EncoderBuffer((EncoderBuffer *)&maybe_mesh);
        if ((iVar11 != -1) && (options.compression_level < 10)) {
          puts("For better compression, increase the compression level up to \'-cl 10\' .\n");
        }
        (*(this->super_EncoderBase<draco::EncoderOptionsBase<int>_>)._vptr_EncoderBase[1])(this);
        draco::EncoderBase<draco::EncoderOptionsBase<draco::GeometryAttribute::Type>_>::~EncoderBase
                  (&encoder.
                    super_EncoderBase<draco::EncoderOptionsBase<draco::GeometryAttribute::Type>_>);
        mesh._M_head_impl = this_00._M_head_impl;
      }
    }
  }
  if ((_Head_base<0UL,_draco::Mesh_*,_false>)mesh._M_head_impl !=
      (_Head_base<0UL,_draco::Mesh_*,_false>)0x0) {
    (*((mesh._M_head_impl)->super_PointCloud)._vptr_PointCloud[1])(mesh._M_head_impl);
  }
LAB_0010fd71:
  anon_unknown.dwarf_8000::Options::~Options(&options);
  return iVar11;
}

Assistant:

int main(int argc, char **argv) {
  Options options;
  const int argc_check = argc - 1;

  for (int i = 1; i < argc; ++i) {
    if (!strcmp("-h", argv[i]) || !strcmp("-?", argv[i])) {
      Usage();
      return 0;
    } else if (!strcmp("-i", argv[i]) && i < argc_check) {
      options.input = argv[++i];
    } else if (!strcmp("-o", argv[i]) && i < argc_check) {
      options.output = argv[++i];
    } else if (!strcmp("-point_cloud", argv[i])) {
      options.is_point_cloud = true;
    } else if (!strcmp("-qp", argv[i]) && i < argc_check) {
      options.pos_quantization_bits = StringToInt(argv[++i]);
      if (options.pos_quantization_bits > 30) {
        printf(
            "Error: The maximum number of quantization bits for the position "
            "attribute is 30.\n");
        return -1;
      }
    } else if (!strcmp("-qt", argv[i]) && i < argc_check) {
      options.tex_coords_quantization_bits = StringToInt(argv[++i]);
      if (options.tex_coords_quantization_bits > 30) {
        printf(
            "Error: The maximum number of quantization bits for the texture "
            "coordinate attribute is 30.\n");
        return -1;
      }
    } else if (!strcmp("-qn", argv[i]) && i < argc_check) {
      options.normals_quantization_bits = StringToInt(argv[++i]);
      if (options.normals_quantization_bits > 30) {
        printf(
            "Error: The maximum number of quantization bits for the normal "
            "attribute is 30.\n");
        return -1;
      }
    } else if (!strcmp("-qg", argv[i]) && i < argc_check) {
      options.generic_quantization_bits = StringToInt(argv[++i]);
      if (options.generic_quantization_bits > 30) {
        printf(
            "Error: The maximum number of quantization bits for generic "
            "attributes is 30.\n");
        return -1;
      }
    } else if (!strcmp("-cl", argv[i]) && i < argc_check) {
      options.compression_level = StringToInt(argv[++i]);
    } else if (!strcmp("--skip", argv[i]) && i < argc_check) {
      if (!strcmp("NORMAL", argv[i + 1])) {
        options.normals_quantization_bits = -1;
      } else if (!strcmp("TEX_COORD", argv[i + 1])) {
        options.tex_coords_quantization_bits = -1;
      } else if (!strcmp("GENERIC", argv[i + 1])) {
        options.generic_quantization_bits = -1;
      } else {
        printf("Error: Invalid attribute name after --skip\n");
        return -1;
      }
      ++i;
    } else if (!strcmp("--metadata", argv[i])) {
      options.use_metadata = true;
    } else if (!strcmp("-preserve_polygons", argv[i])) {
      options.preserve_polygons = true;
    }
  }
  if (argc < 3 || options.input.empty()) {
    Usage();
    return -1;
  }

  std::unique_ptr<draco::PointCloud> pc;
  draco::Mesh *mesh = nullptr;
  if (!options.is_point_cloud) {
    draco::Options load_options;
    load_options.SetBool("use_metadata", options.use_metadata);
    load_options.SetBool("preserve_polygons", options.preserve_polygons);
    auto maybe_mesh = draco::ReadMeshFromFile(options.input, load_options);
    if (!maybe_mesh.ok()) {
      printf("Failed loading the input mesh: %s.\n",
             maybe_mesh.status().error_msg());
      return -1;
    }
    mesh = maybe_mesh.value().get();
    pc = std::move(maybe_mesh).value();
  } else {
    auto maybe_pc = draco::ReadPointCloudFromFile(options.input);
    if (!maybe_pc.ok()) {
      printf("Failed loading the input point cloud: %s.\n",
             maybe_pc.status().error_msg());
      return -1;
    }
    pc = std::move(maybe_pc).value();
  }

  if (options.pos_quantization_bits < 0) {
    printf("Error: Position attribute cannot be skipped.\n");
    return -1;
  }

  // Delete attributes if needed. This needs to happen before we set any
  // quantization settings.
  if (options.tex_coords_quantization_bits < 0) {
    if (pc->NumNamedAttributes(draco::GeometryAttribute::TEX_COORD) > 0) {
      options.tex_coords_deleted = true;
    }
    while (pc->NumNamedAttributes(draco::GeometryAttribute::TEX_COORD) > 0) {
      pc->DeleteAttribute(
          pc->GetNamedAttributeId(draco::GeometryAttribute::TEX_COORD, 0));
    }
  }
  if (options.normals_quantization_bits < 0) {
    if (pc->NumNamedAttributes(draco::GeometryAttribute::NORMAL) > 0) {
      options.normals_deleted = true;
    }
    while (pc->NumNamedAttributes(draco::GeometryAttribute::NORMAL) > 0) {
      pc->DeleteAttribute(
          pc->GetNamedAttributeId(draco::GeometryAttribute::NORMAL, 0));
    }
  }
  if (options.generic_quantization_bits < 0) {
    if (pc->NumNamedAttributes(draco::GeometryAttribute::GENERIC) > 0) {
      options.generic_deleted = true;
    }
    while (pc->NumNamedAttributes(draco::GeometryAttribute::GENERIC) > 0) {
      pc->DeleteAttribute(
          pc->GetNamedAttributeId(draco::GeometryAttribute::GENERIC, 0));
    }
  }
#ifdef DRACO_ATTRIBUTE_INDICES_DEDUPLICATION_SUPPORTED
  // If any attribute has been deleted, run deduplication of point indices again
  // as some points can be possibly combined.
  if (options.tex_coords_deleted || options.normals_deleted ||
      options.generic_deleted) {
    pc->DeduplicatePointIds();
  }
#endif

  // Convert compression level to speed (that 0 = slowest, 10 = fastest).
  const int speed = 10 - options.compression_level;

  draco::Encoder encoder;

  // Setup encoder options.
  if (options.pos_quantization_bits > 0) {
    encoder.SetAttributeQuantization(draco::GeometryAttribute::POSITION,
                                     options.pos_quantization_bits);
  }
  if (options.tex_coords_quantization_bits > 0) {
    encoder.SetAttributeQuantization(draco::GeometryAttribute::TEX_COORD,
                                     options.tex_coords_quantization_bits);
  }
  if (options.normals_quantization_bits > 0) {
    encoder.SetAttributeQuantization(draco::GeometryAttribute::NORMAL,
                                     options.normals_quantization_bits);
  }
  if (options.generic_quantization_bits > 0) {
    encoder.SetAttributeQuantization(draco::GeometryAttribute::GENERIC,
                                     options.generic_quantization_bits);
  }
  encoder.SetSpeedOptions(speed, speed);

  if (options.output.empty()) {
    // Create a default output file by attaching .drc to the input file name.
    options.output = options.input + ".drc";
  }

  PrintOptions(*pc, options);

  const bool input_is_mesh = mesh && mesh->num_faces() > 0;

  // Convert to ExpertEncoder that allows us to set per-attribute options.
  std::unique_ptr<draco::ExpertEncoder> expert_encoder;
  if (input_is_mesh) {
    expert_encoder.reset(new draco::ExpertEncoder(*mesh));
  } else {
    expert_encoder.reset(new draco::ExpertEncoder(*pc));
  }
  expert_encoder->Reset(encoder.CreateExpertEncoderOptions(*pc));

  // Check if there is an attribute that stores polygon edges. If so, we disable
  // the default prediction scheme for the attribute as it actually makes the
  // compression worse.
  const int poly_att_id =
      pc->GetAttributeIdByMetadataEntry("name", "added_edges");
  if (poly_att_id != -1) {
    expert_encoder->SetAttributePredictionScheme(
        poly_att_id, draco::PredictionSchemeMethod::PREDICTION_NONE);
  }

  int ret = -1;

  if (input_is_mesh) {
    ret = EncodeMeshToFile(*mesh, options.output, expert_encoder.get());
  } else {
    ret = EncodePointCloudToFile(*pc, options.output, expert_encoder.get());
  }

  if (ret != -1 && options.compression_level < 10) {
    printf(
        "For better compression, increase the compression level up to '-cl 10' "
        ".\n\n");
  }

  return ret;
}